

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

ON_MeshCacheItem * __thiscall ON_MeshCache::Internal_CreateItem(ON_MeshCache *this)

{
  ON_MeshCacheItem *pOVar1;
  
  pOVar1 = (ON_MeshCacheItem *)onmalloc(0x28);
  (pOVar1->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pOVar1->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pOVar1->m_mesh_id).Data1 = 0;
  (pOVar1->m_mesh_id).Data2 = 0;
  (pOVar1->m_mesh_id).Data3 = 0;
  (pOVar1->m_mesh_id).Data4[0] = '\0';
  (pOVar1->m_mesh_id).Data4[1] = '\0';
  (pOVar1->m_mesh_id).Data4[2] = '\0';
  (pOVar1->m_mesh_id).Data4[3] = '\0';
  (pOVar1->m_mesh_id).Data4[4] = '\0';
  (pOVar1->m_mesh_id).Data4[5] = '\0';
  (pOVar1->m_mesh_id).Data4[6] = '\0';
  (pOVar1->m_mesh_id).Data4[7] = '\0';
  pOVar1->m_next = (ON_MeshCacheItem *)0x0;
  (pOVar1->m_mesh_id).Data1 = 0;
  (pOVar1->m_mesh_id).Data2 = 0;
  (pOVar1->m_mesh_id).Data3 = 0;
  (pOVar1->m_mesh_id).Data4[0] = '\0';
  (pOVar1->m_mesh_id).Data4[1] = '\0';
  (pOVar1->m_mesh_id).Data4[2] = '\0';
  (pOVar1->m_mesh_id).Data4[3] = '\0';
  (pOVar1->m_mesh_id).Data4[4] = '\0';
  (pOVar1->m_mesh_id).Data4[5] = '\0';
  (pOVar1->m_mesh_id).Data4[6] = '\0';
  (pOVar1->m_mesh_id).Data4[7] = '\0';
  (pOVar1->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pOVar1->m_mesh_sp).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pOVar1->m_next = (ON_MeshCacheItem *)0x0;
  return pOVar1;
}

Assistant:

class ON_MeshCacheItem* ON_MeshCache::Internal_CreateItem()
{
  // Items must come from the main memory pool to prevent
  // crashing when meshing operations are canceled.
  // Use placement operator new with main heap memory.
  ON_MeshCacheItem* item;
  void* p = onmalloc(sizeof(*item));
  item = new (p) ON_MeshCacheItem();
  return item;
}